

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O3

bool duckdb::TryDecimalStringCast<short,(char)46>
               (char *string_ptr,idx_t string_size,short *result,uint8_t width,uint8_t scale)

{
  short sVar1;
  byte bVar2;
  bool bVar3;
  undefined7 uVar6;
  ulong uVar4;
  ulong uVar5;
  uint uVar7;
  undefined7 in_register_00000009;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  idx_t iVar11;
  char *pcVar12;
  ulong uVar13;
  byte bVar14;
  ulong uVar15;
  ulong uVar16;
  IntegerCastData<short> local_56;
  DecimalCastData<short> local_54;
  undefined4 local_48;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  local_54.result = 0;
  local_54.excessive_decimals = '\0';
  local_54.exponent_type = NONE;
  local_54.digit_count = '\0';
  local_54.decimal_count = '\0';
  local_54.round_set = false;
  local_54.should_round = false;
  local_54.limit =
       *(StoreType *)
        (NumericHelper::POWERS_OF_TEN + (CONCAT71(in_register_00000009,width) & 0xffffffff) * 8);
  if (string_size == 0) {
    return false;
  }
  uVar10 = 0;
  while ((bVar2 = string_ptr[uVar10], bVar2 - 9 < 5 || (bVar2 == 0x20))) {
    uVar10 = uVar10 + 1;
    if (string_size == uVar10) {
      return false;
    }
  }
  local_54.width = width;
  local_54.scale = scale;
  if (bVar2 == 0x2d) {
    if (string_size - 1 == uVar10) {
      DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,true>(&local_54);
      return false;
    }
    uVar13 = string_size - uVar10;
    uVar8 = 1;
    local_54.digit_count = 0;
    local_54.result = 0;
    do {
      bVar2 = string_ptr[uVar10 + uVar8];
      bVar14 = bVar2 - 0x30;
      if (9 < bVar14) {
        local_54._5_3_ = 0;
        uVar15 = uVar8;
        if (bVar2 != 0x2e) goto LAB_0166d9bd;
        uVar16 = uVar8 + 1;
        uVar9 = uVar16;
        if (uVar13 <= uVar16) goto LAB_0166da8c;
        local_48 = 0;
        local_44 = 0;
        local_54.decimal_count = 0;
        uVar4 = uVar16;
        uVar15 = uVar16;
        goto LAB_0166d76f;
      }
      if (bVar14 == 0 && local_54.result == 0) {
        local_54.result = 0;
      }
      else {
        if ((uint)width - (uint)scale == (uint)local_54.digit_count) {
          return false;
        }
        if (local_54.result < -0xccc) {
          return false;
        }
        local_54.digit_count = local_54.digit_count + 1;
        local_54.result = local_54.result * 10 - (ushort)bVar14;
      }
      uVar9 = uVar13;
      if (~uVar8 + string_size == uVar10) break;
      if (string_ptr[uVar10 + 1 + uVar8] == '_') {
        if ((string_size - uVar8) - 2 == uVar10) {
          return false;
        }
        uVar8 = uVar8 + 2;
        if (9 < (byte)(string_ptr[uVar10 + uVar8] - 0x30U)) {
          return false;
        }
      }
      else {
        uVar8 = uVar8 + 1;
      }
      uVar9 = uVar8;
    } while (uVar8 < uVar13);
    local_54._5_3_ = 0;
    goto LAB_0166d82b;
  }
  if (bVar2 == 0x30 && string_size - 1 != uVar10) {
    bVar14 = string_ptr[uVar10 + 1];
    if (bVar14 < 0x62) {
      if ((bVar14 != 0x42) && (bVar14 != 0x58)) goto LAB_0166d63e;
    }
    else if ((bVar14 != 0x62) && (bVar14 != 0x78)) goto LAB_0166d63e;
    if ((string_size - uVar10) - 3 < 0xfffffffffffffffe) {
      return false;
    }
LAB_0166d710:
    DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,false>(&local_54);
    return false;
  }
LAB_0166d63e:
  uVar8 = string_size - uVar10;
  uVar13 = (ulong)(bVar2 == 0x2b);
  if (uVar8 <= uVar13) goto LAB_0166d710;
  local_54.digit_count = 0;
  local_54.result = 0;
  uVar15 = uVar13;
  do {
    bVar2 = string_ptr[uVar10 + uVar15];
    bVar14 = bVar2 - 0x30;
    if (9 < bVar14) {
      local_54._5_3_ = 0;
      uVar16 = uVar15;
      if (bVar2 != 0x2e) goto LAB_0166dadb;
      uVar9 = uVar15 + 1;
      uVar4 = uVar9;
      if (uVar8 <= uVar9) goto LAB_0166dba2;
      local_44 = (uint)local_54.digit_count;
      local_40 = local_40 & 0xffffffff00000000;
      local_48 = 0;
      local_54.decimal_count = 0;
      uVar5 = uVar9;
      uVar16 = uVar9;
      goto LAB_0166d899;
    }
    if (bVar14 == 0 && local_54.result == 0) {
      local_54.result = 0;
    }
    else {
      if ((uint)width - (uint)scale == (uint)local_54.digit_count) {
        return false;
      }
      if (0xccc < local_54.result) {
        return false;
      }
      local_54.digit_count = local_54.digit_count + 1;
      local_54.result = (ushort)bVar14 + local_54.result * 10;
    }
    uVar4 = uVar8;
    if (~uVar15 + string_size == uVar10) break;
    if (string_ptr[uVar10 + 1 + uVar15] == '_') {
      if ((string_size - uVar15) - 2 == uVar10) {
        return false;
      }
      uVar15 = uVar15 + 2;
      if (9 < (byte)(string_ptr[uVar10 + uVar15] - 0x30U)) {
        return false;
      }
    }
    else {
      uVar15 = uVar15 + 1;
    }
    uVar4 = uVar15;
  } while (uVar15 < uVar8);
  local_54._5_3_ = 0;
  goto LAB_0166d957;
LAB_0166d76f:
  bVar2 = string_ptr[uVar10 + uVar15];
  uVar6 = (undefined7)(uVar4 >> 8);
  bVar14 = bVar2 - 0x30;
  local_40 = uVar16;
  if (9 < bVar14) {
    local_54.round_set = local_44._0_1_;
    local_54.should_round = (bool)(char)local_48;
    if (uVar15 <= uVar16 && uVar8 < 2) {
      return false;
    }
LAB_0166d9bd:
    uVar7 = (uint)bVar2;
    if (bVar2 < 0x20) {
      if (4 < uVar7 - 9) {
        return false;
      }
LAB_0166d9d3:
      uVar15 = uVar15 + 1;
      uVar9 = uVar15;
      if (uVar15 < uVar13) {
        do {
          if ((4 < (byte)string_ptr[uVar10 + uVar15] - 9) && (string_ptr[uVar10 + uVar15] != 0x20))
          {
            return false;
          }
          uVar15 = uVar15 + 1;
          uVar9 = uVar13;
        } while (uVar13 != uVar15);
      }
      goto LAB_0166d82b;
    }
    if ((bVar2 != 0x65) && (uVar7 != 0x45)) {
      if (uVar7 != 0x20) {
        return false;
      }
      goto LAB_0166d9d3;
    }
    if (uVar15 == 1) {
      return false;
    }
    if (uVar13 <= uVar15 + 1) {
      return false;
    }
    local_56.result = 0;
    pcVar12 = string_ptr + uVar10 + uVar15 + 1;
    iVar11 = ~uVar10 + (string_size - uVar15);
    if (*pcVar12 == '-') {
      bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar12,iVar11,&local_56,false);
    }
    else {
      bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar12,iVar11,&local_56,false);
    }
    if (bVar3 == false) {
      return false;
    }
    bVar3 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<short>,true>
                      (&local_54,(int)local_56.result);
    goto LAB_0166dc01;
  }
  if ((local_54.decimal_count == scale) && (local_44._0_1_ == false)) {
    local_48 = (undefined4)CONCAT71(uVar6,4 < bVar14);
    local_44 = (uint)CONCAT71(uVar6,1);
  }
  bVar3 = (uint)local_54.decimal_count + (uint)local_54.digit_count < 4;
  sVar1 = local_54.result * 10 - (ushort)bVar14;
  if (!bVar3) {
    sVar1 = local_54.result;
  }
  local_54.result = sVar1;
  local_54.decimal_count = local_54.decimal_count + bVar3;
  uVar4 = ~uVar15 + string_size;
  uVar9 = uVar13;
  if (uVar4 != uVar10) goto code_r0x0166d7d8;
  goto LAB_0166da6c;
code_r0x0166d7d8:
  if (string_ptr[uVar10 + 1 + uVar15] == '_') {
    if ((string_size - uVar15) - 2 == uVar10) {
      return false;
    }
    uVar15 = uVar15 + 2;
    bVar2 = (string_ptr + uVar15)[uVar10] - 0x30;
    uVar4 = CONCAT71((int7)((ulong)(string_ptr + uVar15) >> 8),bVar2);
    if (9 < bVar2) {
      return false;
    }
  }
  else {
    uVar15 = uVar15 + 1;
  }
  uVar9 = uVar15;
  if (uVar13 <= uVar15) goto LAB_0166da6c;
  goto LAB_0166d76f;
LAB_0166da6c:
  local_54.round_set = SUB41(local_44,0);
  local_54.should_round = (bool)(char)local_48;
LAB_0166da8c:
  if ((uVar8 < 2) && (uVar9 <= uVar16)) {
    return false;
  }
LAB_0166d82b:
  bVar3 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,true>(&local_54);
  if (!bVar3) {
    return false;
  }
  if (uVar9 < 2) {
    return false;
  }
  goto LAB_0166d976;
LAB_0166d899:
  bVar2 = string_ptr[uVar10 + uVar16];
  uVar6 = (undefined7)(uVar5 >> 8);
  bVar14 = bVar2 - 0x30;
  local_38 = uVar9;
  if (9 < bVar14) {
    local_54.round_set = local_48._0_1_;
    local_54.should_round = (bool)(char)local_40;
    if (uVar16 <= uVar9 && uVar15 <= uVar13) {
      return false;
    }
LAB_0166dadb:
    uVar7 = (uint)bVar2;
    if (bVar2 < 0x20) {
      if (4 < uVar7 - 9) {
        return false;
      }
    }
    else {
      if ((bVar2 == 0x65) || (uVar7 == 0x45)) {
        if (uVar16 == uVar13) {
          return false;
        }
        if (uVar8 <= uVar16 + 1) {
          return false;
        }
        local_56.result = 0;
        pcVar12 = string_ptr + uVar10 + uVar16 + 1;
        iVar11 = ~uVar10 + (string_size - uVar16);
        if (*pcVar12 == '-') {
          bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar12,iVar11,&local_56,false);
        }
        else {
          bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar12,iVar11,&local_56,false);
        }
        if (bVar3 == false) {
          return false;
        }
        bVar3 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<short>,false>
                          (&local_54,(int)local_56.result);
LAB_0166dc01:
        if (bVar3 == false) {
          return false;
        }
        goto LAB_0166d976;
      }
      if (uVar7 != 0x20) {
        return false;
      }
    }
    uVar16 = uVar16 + 1;
    uVar4 = uVar16;
    if (uVar16 < uVar8) {
      do {
        if ((4 < (byte)string_ptr[uVar10 + uVar16] - 9) && (string_ptr[uVar10 + uVar16] != 0x20)) {
          return false;
        }
        uVar16 = uVar16 + 1;
        uVar4 = uVar8;
      } while (uVar8 != uVar16);
    }
    goto LAB_0166d957;
  }
  if ((local_54.decimal_count == scale) && (local_48._0_1_ == false)) {
    local_40 = CONCAT44(local_40._4_4_,(int)CONCAT71(uVar6,4 < bVar14));
    local_48 = (undefined4)CONCAT71(uVar6,1);
  }
  bVar3 = local_54.decimal_count + local_44 < 4;
  sVar1 = (ushort)bVar14 + local_54.result * 10;
  if (!bVar3) {
    sVar1 = local_54.result;
  }
  local_54.result = sVar1;
  local_54.decimal_count = local_54.decimal_count + bVar3;
  uVar5 = ~uVar16 + string_size;
  uVar4 = uVar8;
  if (uVar5 != uVar10) goto code_r0x0166d904;
  goto LAB_0166db82;
code_r0x0166d904:
  if (string_ptr[uVar10 + 1 + uVar16] == '_') {
    if ((string_size - uVar16) - 2 == uVar10) {
      return false;
    }
    uVar16 = uVar16 + 2;
    bVar2 = (string_ptr + uVar16)[uVar10] - 0x30;
    uVar5 = CONCAT71((int7)((ulong)(string_ptr + uVar16) >> 8),bVar2);
    if (9 < bVar2) {
      return false;
    }
  }
  else {
    uVar16 = uVar16 + 1;
  }
  uVar4 = uVar16;
  if (uVar8 <= uVar16) goto LAB_0166db82;
  goto LAB_0166d899;
LAB_0166db82:
  local_54.round_set = SUB41(local_48,0);
  local_54.should_round = (bool)(char)local_40;
LAB_0166dba2:
  if ((uVar15 <= uVar13) && (uVar4 <= uVar9)) {
    return false;
  }
LAB_0166d957:
  bVar3 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,false>(&local_54);
  if (!bVar3) {
    return false;
  }
  if (uVar4 <= uVar13) {
    return false;
  }
LAB_0166d976:
  *result = local_54.result;
  return true;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		return false;
	}
	result = state.result;
	return true;
}